

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeRecordCompareString(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint local_2c;
  
  uVar5 = (int)*(char *)((long)pKey1 + 1);
  if (*(char *)((long)pKey1 + 1) < '\0') {
    sqlite3GetVarint32((uchar *)((long)pKey1 + 1),&local_2c);
    uVar5 = local_2c;
  }
  if ((int)uVar5 < 0xc) {
LAB_0016fa36:
    cVar1 = pPKey2->r1;
  }
  else {
    if ((uVar5 & 1) != 0) {
      uVar5 = uVar5 - 0xc >> 1;
      if (nKey1 < (int)(uVar5 + *pKey1)) {
        iVar3 = sqlite3CorruptError(0x13c8b);
        pPKey2->errCode = (u8)iVar3;
        return 0;
      }
      uVar2 = pPKey2->aMem->n;
      uVar4 = uVar5;
      if ((int)uVar2 < (int)uVar5) {
        uVar4 = uVar2;
      }
      iVar3 = memcmp((void *)((ulong)*pKey1 + (long)pKey1),pPKey2->aMem->z,(long)(int)uVar4);
      bVar7 = false;
      bVar6 = iVar3 == 0;
      if (bVar6) {
        bVar7 = SBORROW4(uVar5,uVar2);
        iVar3 = uVar5 - uVar2;
        bVar6 = uVar5 == uVar2;
        if (bVar6) {
          if (pPKey2->nField < 2) {
            pPKey2->eqSeen = '\x01';
            return (int)pPKey2->default_rc;
          }
          iVar3 = sqlite3VdbeRecordCompareWithSkip(nKey1,pKey1,pPKey2,1);
          return iVar3;
        }
      }
      if (bVar6 || bVar7 != iVar3 < 0) goto LAB_0016fa36;
    }
    cVar1 = pPKey2->r2;
  }
  return (int)cVar1;
}

Assistant:

static int vdbeRecordCompareString(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey1 = (const u8*)pKey1;
  int serial_type;
  int res;

  assert( pPKey2->aMem[0].flags & MEM_Str );
  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  getVarint32(&aKey1[1], serial_type);
  if( serial_type<12 ){
    res = pPKey2->r1;      /* (pKey1/nKey1) is a number or a null */
  }else if( !(serial_type & 0x01) ){ 
    res = pPKey2->r2;      /* (pKey1/nKey1) is a blob */
  }else{
    int nCmp;
    int nStr;
    int szHdr = aKey1[0];

    nStr = (serial_type-12) / 2;
    if( (szHdr + nStr) > nKey1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;    /* Corruption */
    }
    nCmp = MIN( pPKey2->aMem[0].n, nStr );
    res = memcmp(&aKey1[szHdr], pPKey2->aMem[0].z, nCmp);

    if( res==0 ){
      res = nStr - pPKey2->aMem[0].n;
      if( res==0 ){
        if( pPKey2->nField>1 ){
          res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
        }else{
          res = pPKey2->default_rc;
          pPKey2->eqSeen = 1;
        }
      }else if( res>0 ){
        res = pPKey2->r2;
      }else{
        res = pPKey2->r1;
      }
    }else if( res>0 ){
      res = pPKey2->r2;
    }else{
      res = pPKey2->r1;
    }
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res)
       || CORRUPT_DB
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  return res;
}